

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O0

void __thiscall QStandardItemPrivate::setModel(QStandardItemPrivate *this,QStandardItemModel *mod)

{
  long lVar1;
  bool bVar2;
  QStandardItemPrivate *pQVar3;
  QStandardItemModelPrivate *pQVar4;
  QStandardItem **t;
  qsizetype qVar5;
  const_reference ppQVar6;
  QList<QStandardItem_*> *in_RSI;
  QStandardItem *in_RDI;
  long in_FS_OFFSET;
  int i;
  QList<QStandardItem_*> *childList;
  QStandardItem *itm;
  QStandardItem *chi;
  QStack<QStandardItem_*> stack;
  QStandardItem **in_stack_ffffffffffffff58;
  QStack<QStandardItem_*> *in_stack_ffffffffffffff60;
  QList<QStandardItem_*> *this_00;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QList<QStandardItem_*>::isEmpty((QList<QStandardItem_*> *)0x8cd2b9);
  if (bVar2) {
    if (in_RDI->_vptr_QStandardItem != (_func_int **)0x0) {
      pQVar4 = QStandardItemModel::d_func((QStandardItemModel *)0x8cd2d7);
      QStandardItemModel::indexFromItem
                ((QStandardItemModel *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80)
                 ,in_RDI);
      QAbstractItemModelPrivate::invalidatePersistentIndex((QModelIndex *)pQVar4);
    }
    in_RDI->_vptr_QStandardItem = (_func_int **)in_RSI;
  }
  else {
    QStack<QStandardItem_*>::QStack((QStack<QStandardItem_*> *)0x8cd34d);
    QStack<QStandardItem_*>::push(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    while (bVar2 = QList<QStandardItem_*>::isEmpty((QList<QStandardItem_*> *)0x8cd36a),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      QStack<QStandardItem_*>::pop((QStack<QStandardItem_*> *)0x8cd37f);
      pQVar3 = QStandardItem::d_func((QStandardItem *)0x8cd38e);
      if (pQVar3->model != (QStandardItemModel *)0x0) {
        QStandardItem::d_func((QStandardItem *)0x8cd39e);
        pQVar4 = QStandardItemModel::d_func((QStandardItemModel *)0x8cd3a6);
        QStandardItem::d_func((QStandardItem *)0x8cd3b5);
        QStandardItemModel::indexFromItem
                  ((QStandardItemModel *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_RDI);
        QAbstractItemModelPrivate::invalidatePersistentIndex((QModelIndex *)pQVar4);
      }
      this_00 = in_RSI;
      pQVar3 = QStandardItem::d_func((QStandardItem *)0x8cd3ea);
      pQVar3->model = (QStandardItemModel *)this_00;
      pQVar3 = QStandardItem::d_func((QStandardItem *)0x8cd40b);
      in_stack_ffffffffffffff84 = 0;
      while( true ) {
        t = (QStandardItem **)(long)in_stack_ffffffffffffff84;
        qVar5 = QList<QStandardItem_*>::size(&pQVar3->children);
        if (qVar5 <= (long)t) break;
        ppQVar6 = QList<QStandardItem_*>::at(this_00,(qsizetype)t);
        if (*ppQVar6 != (QStandardItem *)0x0) {
          QStack<QStandardItem_*>::push((QStack<QStandardItem_*> *)this_00,t);
        }
        in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 + 1;
      }
    }
    QStack<QStandardItem_*>::~QStack((QStack<QStandardItem_*> *)0x8cd487);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QStandardItemPrivate::setModel(QStandardItemModel *mod)
{
    if (children.isEmpty()) {
        if (model)
            model->d_func()->invalidatePersistentIndex(model->indexFromItem(q_ptr));
        model = mod;
    } else {
        QStack<QStandardItem*> stack;
        stack.push(q_ptr);
        while (!stack.isEmpty()) {
            QStandardItem *itm = stack.pop();
            if (itm->d_func()->model) {
                itm->d_func()->model->d_func()->invalidatePersistentIndex(itm->d_func()->model->indexFromItem(itm));
            }
            itm->d_func()->model = mod;
            const QList<QStandardItem*> &childList = itm->d_func()->children;
            for (int i = 0; i < childList.size(); ++i) {
                QStandardItem *chi = childList.at(i);
                if (chi)
                    stack.push(chi);
            }
        }
    }
}